

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_name.c
# Opt level: O2

char * p2sc_name_swap_tmr(char *dir,guint8 *data,size_t len,guint64 o)

{
  uint crc;
  char *pcVar1;
  guint8 local_32;
  char acrc [9];
  
  crc = p2sc_crc32(0,data,len);
  for (; len != 0; len = len >> 8) {
    local_32 = (guint8)len;
    crc = p2sc_crc32(crc,&local_32,1);
  }
  sprintf(acrc,"%08x",(ulong)~crc);
  pcVar1 = ".";
  if (dir != (char *)0x0) {
    pcVar1 = dir;
  }
  pcVar1 = (char *)g_strdup_printf("%s/swap_%014lu_%s.fits",pcVar1,o,acrc);
  return pcVar1;
}

Assistant:

char *p2sc_name_swap_tmr(const char *dir, const guint8 *data, size_t len, guint64 o) {
    guint32 crc = p2sc_crc32_finalise(p2sc_crc32(0, data, len), len);
    char acrc[2 * sizeof crc + 1];

    sprintf(acrc, "%08x", crc);
    return g_strdup_printf("%s" DS "swap_" P_OBET_F "_%s.fits", DN(dir), o, acrc);
}